

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

bool __thiscall argo::json::operator!=(json *this,string *s)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  psVar2 = operator_cast_to_string_(this);
  std::__cxx11::string::string((string *)&local_30,(string *)psVar2);
  bVar1 = std::operator!=(&local_30,s);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool json::operator!=(const std::string &s) const
{
    return static_cast<string>(*this) != s;
}